

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O1

int __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,convertable **d,hint *h)

{
  int *piVar1;
  updates<const_mpt::convertable_*,_mpt::graphic::hint> uVar2;
  char cVar3;
  int iVar4;
  content *d_1;
  undefined8 *puVar5;
  ulong uVar6;
  hint *phVar7;
  undefined8 *puVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar2 = *this;
  if (uVar2 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
    puVar5 = (undefined8 *)0x0;
  }
  else {
    puVar5 = (undefined8 *)0x0;
    if (*(long *)((long)uVar2 + 8) == 0) {
      puVar5 = (undefined8 *)((long)uVar2 + 0x20);
    }
  }
  if ((uVar2 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) ||
     (*(long *)((long)uVar2 + 8) != 0)) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ulong *)((long)uVar2 + 0x18) >> 4;
  }
  if (uVar9 != 0) {
    phVar7 = (hint *)(puVar5 + 1);
    uVar6 = uVar9;
    do {
      if (((*(int *)(phVar7 + 4) != 0) && (*d == *(convertable **)(phVar7 + -8))) &&
         (cVar3 = mpt::graphic::hint::merge(phVar7,(int)h), cVar3 != '\0')) {
        *(int *)(phVar7 + 4) = *(int *)(phVar7 + 4) + 1;
        return 1;
      }
      phVar7 = phVar7 + 0x10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  iVar4 = 1;
  bVar10 = uVar9 != 0;
  if (bVar10) {
    if (*(int *)((long)puVar5 + 0xc) != 0) {
      uVar6 = 0;
      puVar8 = puVar5;
      do {
        if (uVar9 - 1 == uVar6) {
          bVar10 = false;
          goto LAB_001027b4;
        }
        puVar5 = puVar8 + 2;
        uVar6 = uVar6 + 1;
        piVar1 = (int *)((long)puVar8 + 0x1c);
        puVar8 = puVar5;
      } while (*piVar1 != 0);
      bVar10 = uVar6 < uVar9;
    }
    *puVar5 = *d;
    *(undefined4 *)(puVar5 + 1) = *(undefined4 *)h;
    *(undefined4 *)((long)puVar5 + 0xc) = 1;
    iVar4 = 0;
  }
LAB_001027b4:
  if (!bVar10) {
    puVar5 = (undefined8 *)mpt::array::append((ulong)this,(void *)0x10);
    if (puVar5 == (undefined8 *)0x0) {
      iVar4 = -4;
    }
    else {
      *puVar5 = *d;
      *(undefined4 *)(puVar5 + 1) = *(undefined4 *)h;
      *(undefined4 *)((long)puVar5 + 0xc) = 1;
      iVar4 = 2;
    }
  }
  return iVar4;
}

Assistant:

int add(const T &d, const H &h = H())
	{
		element *cmp = static_cast<element *>(base());
		long max = length();
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				continue;
			}
			// different data elements
			if (d != cmp[i].data) {
				continue;
			}
			if (cmp[i].hint.merge(h)) {
				++cmp[i].used;
				return 1;
			}
		}
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				new (cmp + i) element(d, h);
				return 0;
			}
		}
		if (!(cmp = static_cast<element *>(array::append(sizeof(*cmp))))) {
			return BadOperation;
		}
		new (cmp) element(d, h);
		return 2;
	}